

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects_Buffer.cpp
# Opt level: O2

void __thiscall Effects_Buffer::mix_mono(Effects_Buffer *this,blip_sample_t *out_,blargg_long count)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
  uVar1 = *(undefined4 *)&this->field_0x38;
  lVar2 = *(long *)&this->field_0x28;
  lVar3 = 0;
  iVar8 = *(int *)&this->field_0x34;
  while( true ) {
    bVar4 = (byte)uVar1;
    uVar6 = iVar8 >> 0xe;
    if (count >> 1 == (int)lVar3) break;
    iVar9 = (*(int *)(lVar2 + lVar3 * 8) - (iVar8 >> (bVar4 & 0x1f))) + iVar8;
    iVar5 = *(int *)(lVar2 + 4 + lVar3 * 8);
    uVar10 = -(uint)(-0x7fff0001 < (int)(uVar6 + 0x8000 ^ 0x80000000));
    uVar11 = -(uint)(-0x7fff0001 < (int)((iVar9 >> 0xe) + 0x8000U ^ 0x80000000));
    uVar6 = ~uVar10 & uVar6 | 0x7fffU - (iVar8 >> 0x1f) & uVar10;
    uVar10 = ~uVar11 & iVar9 >> 0xe | 0x7fffU - (iVar9 >> 0x1f) & uVar11;
    *(uint *)(out_ + lVar3 * 4) = uVar6 << 0x10 | uVar6 & 0xffff;
    *(uint *)((long)(out_ + lVar3 * 4) + 4) = uVar10 << 0x10 | uVar10 & 0xffff;
    lVar3 = lVar3 + 1;
    iVar8 = (iVar9 + iVar5) - (iVar9 >> (bVar4 & 0x1f));
  }
  iVar5 = iVar8;
  if ((count & 1U) != 0) {
    iVar5 = (*(int *)(lVar2 + lVar3 * 8) - (iVar8 >> (bVar4 & 0x1f))) + iVar8;
    sVar7 = (short)uVar6;
    out_[lVar3 * 4] = sVar7;
    out_[lVar3 * 4 + 1] = sVar7;
    if ((int)sVar7 != uVar6) {
      sVar7 = 0x7fff - (short)(iVar8 >> 0x1f);
      out_[lVar3 * 4] = sVar7;
      out_[lVar3 * 4 + 1] = sVar7;
    }
  }
  *(int *)&this->field_0x34 = iVar5;
  return;
}

Assistant:

void Effects_Buffer::mix_mono( blip_sample_t* out_, blargg_long count )
{
	blip_sample_t* BLIP_RESTRICT out = out_;
	int const bass = BLIP_READER_BASS( bufs [0] );
	BLIP_READER_BEGIN( c, bufs [0] );
	
	// unrolled loop
	for ( blargg_long n = count >> 1; n; --n )
	{
		blargg_long cs0 = BLIP_READER_READ( c );
		BLIP_READER_NEXT( c, bass );
		
		blargg_long cs1 = BLIP_READER_READ( c );
		BLIP_READER_NEXT( c, bass );
		
		if ( (BOOST::int16_t) cs0 != cs0 )
			cs0 = 0x7FFF - (cs0 >> 24);
		((BOOST::uint32_t*) out) [0] = ((BOOST::uint16_t) cs0) | (cs0 << 16);
		
		if ( (BOOST::int16_t) cs1 != cs1 )
			cs1 = 0x7FFF - (cs1 >> 24);
		((BOOST::uint32_t*) out) [1] = ((BOOST::uint16_t) cs1) | (cs1 << 16);
		out += 4;
	}
	
	if ( count & 1 )
	{
		int s = BLIP_READER_READ( c );
		BLIP_READER_NEXT( c, bass );
		out [0] = s;
		out [1] = s;
		if ( (BOOST::int16_t) s != s )
		{
			s = 0x7FFF - (s >> 24);
			out [0] = s;
			out [1] = s;
		}
	}
	
	BLIP_READER_END( c, bufs [0] );
}